

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

void monster_index_move(chunk *c,wchar_t i1,wchar_t i2)

{
  loc grid;
  object *poVar1;
  _Bool _Var2;
  monster *pmVar3;
  object **ppoVar4;
  monster *pmVar5;
  
  if (i1 != i2) {
    pmVar3 = cave_monster((chunk_conflict *)c,i1);
    if (pmVar3 != (monster *)0x0) {
      grid.x = (pmVar3->grid).x;
      grid.y = (pmVar3->grid).y;
      square_set_mon((chunk_conflict *)c,grid,i2);
      pmVar3->midx = i2;
      _Var2 = monster_group_change_index((chunk_conflict *)c,i2,i1);
      if (!_Var2) {
        quit("Bad monster group info!");
        monster_groups_verify((chunk_conflict *)c);
      }
      ppoVar4 = &pmVar3->held_obj;
      while( true ) {
        poVar1 = *ppoVar4;
        if (poVar1 == (object *)0x0) break;
        poVar1->held_m_idx = (int16_t)i2;
        ppoVar4 = &poVar1->next;
      }
      if (pmVar3->mimicked_obj != (object *)0x0) {
        pmVar3->mimicked_obj->mimicking_m_idx = (int16_t)i2;
      }
      pmVar5 = target_get_monster();
      if (pmVar5 == pmVar3) {
        pmVar5 = cave_monster((chunk_conflict *)c,i2);
        target_set_monster(pmVar5);
      }
      if (player->upkeep->health_who == pmVar3) {
        pmVar3 = cave_monster((chunk_conflict *)c,i2);
        player->upkeep->health_who = pmVar3;
      }
      pmVar3 = cave_monster((chunk_conflict *)c,i2);
      pmVar5 = cave_monster((chunk_conflict *)c,i1);
      memcpy(pmVar3,pmVar5,0x1f0);
      pmVar3 = cave_monster((chunk_conflict *)c,i1);
      memset(pmVar3,0,0x1f0);
      return;
    }
  }
  return;
}

Assistant:

void monster_index_move(struct chunk *c, int i1, int i2)
{
	struct monster *mon;
	struct object *obj;

	/* Do nothing */
	if (i1 == i2) return;

	/* Old monster */
	mon = cave_monster(c, i1);
	if (!mon) return;

	/* Update the cave */
	square_set_mon(c, mon->grid, i2);

	/* Update midx */
	mon->midx = i2;

	/* Update group */
	if (!monster_group_change_index(c, i2, i1)) {
		quit("Bad monster group info!") ;
		monster_groups_verify(c);
	}

	/* Repair objects being carried by monster */
	for (obj = mon->held_obj; obj; obj = obj->next)
		obj->held_m_idx = i2;

	/* Move mimicked objects (heh) */
	if (mon->mimicked_obj)
		mon->mimicked_obj->mimicking_m_idx = i2;

	/* Update the target */
	if (target_get_monster() == mon)
		target_set_monster(cave_monster(c, i2));

	/* Update the health bar */
	if (player->upkeep->health_who == mon)
		player->upkeep->health_who = cave_monster(c, i2);

	/* Move monster */
	memcpy(cave_monster(c, i2),
			cave_monster(c, i1),
			sizeof(struct monster));

	/* Wipe hole */
	memset(cave_monster(c, i1), 0, sizeof(struct monster));
}